

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_Logistic_Test::TestBody(Sampling_Logistic_Test *this)

{
  bool bVar1;
  int iVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  float fVar6;
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 checkErr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Float dx;
  Float dp;
  Float cp;
  Float cx;
  Float u;
  Uniform1DIter __end2;
  Uniform1DIter __begin2;
  Uniform1D *__range2;
  PiecewiseConstant1D distrib;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  anon_class_24_3_4e94f2eb logistic;
  Float b;
  Float a;
  Float s;
  Float *p;
  Float (*__end1) [3];
  Float (*__begin1) [3];
  Float (*__range1) [3] [3];
  Float params [3] [3];
  Float in_stack_fffffffffffffcc8;
  Float in_stack_fffffffffffffccc;
  PiecewiseConstant1D *in_stack_fffffffffffffcd0;
  Float in_stack_fffffffffffffcd8;
  Float in_stack_fffffffffffffcdc;
  function<float_(float)> *in_stack_fffffffffffffce0;
  Message *in_stack_fffffffffffffce8;
  Message *in_stack_fffffffffffffcf0;
  Message *in_stack_fffffffffffffcf8;
  AssertHelper *in_stack_fffffffffffffd00;
  undefined6 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  Float in_stack_fffffffffffffd10;
  Float in_stack_fffffffffffffd14;
  char *in_stack_fffffffffffffd18;
  PiecewiseConstant1D *in_stack_fffffffffffffd20;
  Message *in_stack_fffffffffffffd30;
  Message *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  AssertionResult *in_stack_fffffffffffffd48;
  AssertHelper *in_stack_fffffffffffffd50;
  Message *in_stack_fffffffffffffd58;
  function<float_(float)> *in_stack_fffffffffffffd60;
  Allocator in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 uVar7;
  undefined4 uVar8;
  char *expr1;
  string local_258 [44];
  Float local_22c;
  Float in_stack_fffffffffffffde0;
  Float in_stack_fffffffffffffde4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffde8;
  Allocator in_stack_fffffffffffffdf0;
  span<const_float> in_stack_fffffffffffffdf8;
  AssertionResult local_1e8 [2];
  undefined8 local_1c8;
  float local_1bc;
  AssertionResult local_1b8;
  Float local_1a4;
  float local_1a0;
  Float local_19c;
  Float local_198;
  Float local_194;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_178 [3];
  undefined1 local_160 [24];
  undefined1 *local_148;
  undefined1 local_128 [104];
  char local_c0 [64];
  undefined4 *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 local_38 [9];
  undefined4 auStack_14 [5];
  
  memcpy(local_38,&DAT_00b388a0,0x24);
  local_50 = auStack_14;
  local_48 = local_38;
  local_40 = local_48;
  for (; local_48 != local_50; local_48 = local_48 + 3) {
    local_58 = local_48;
    local_5c = *local_48;
    local_60 = local_48[1];
    local_64 = local_48[2];
    local_80 = &local_5c;
    local_78 = &local_60;
    local_70 = &local_64;
    expr1 = local_c0;
    std::function<float(float)>::function<Sampling_Logistic_Test::TestBody()::__0&,void>
              (in_stack_fffffffffffffce0,
               (anon_class_24_3_4e94f2eb *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffcd0);
    pbrt::Sample1DFunction
              (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
               (int)in_stack_fffffffffffffd58,(Float)((ulong)in_stack_fffffffffffffd50 >> 0x20),
               SUB84(in_stack_fffffffffffffd50,0),in_stack_fffffffffffffd68);
    std::function<float_(float)>::~function((function<float_(float)> *)0x6416e9);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((span<const_float> *)in_stack_fffffffffffffce0,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    uVar7 = local_60;
    uVar8 = local_64;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffcd0);
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              ((PiecewiseConstant1D *)in_stack_fffffffffffffde8.ptr_,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffde4,in_stack_fffffffffffffde0,in_stack_fffffffffffffdf0);
    pbrt::Uniform1D::RNGGenerator
              ((Uniform1D *)in_stack_fffffffffffffce0,(int)in_stack_fffffffffffffcdc,
               (uint64_t)in_stack_fffffffffffffcd0,
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    local_148 = local_160;
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
              ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
               in_stack_fffffffffffffcd0);
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
              ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
               in_stack_fffffffffffffcd0);
    while( true ) {
      bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                        ((IndexingIterator<pbrt::detail::Uniform1DIter> *)in_stack_fffffffffffffcd0,
                         (Uniform1DIter *)
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      in_stack_fffffffffffffd8c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd8c);
      if (!bVar1) break;
      FVar3 = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x641805);
      local_194 = FVar3;
      FVar4 = pbrt::SampleTrimmedLogistic
                        ((Float)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                         SUB84(in_stack_fffffffffffffce0,0),in_stack_fffffffffffffcdc,
                         in_stack_fffffffffffffcd8);
      local_198 = FVar4;
      FVar5 = pbrt::TrimmedLogisticPDF
                        ((Float)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                         SUB84(in_stack_fffffffffffffcd0,0),in_stack_fffffffffffffccc,
                         in_stack_fffffffffffffcc8);
      iVar2 = (int)local_128;
      local_19c = FVar5;
      local_1a4 = pbrt::PiecewiseConstant1D::Sample
                            (in_stack_fffffffffffffd20,
                             (Float)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                             (Float *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             (int *)CONCAT17(in_stack_fffffffffffffd0f,
                                             CONCAT16(in_stack_fffffffffffffd0e,
                                                      in_stack_fffffffffffffd08)));
      fVar6 = local_198 - local_1a4;
      std::abs(iVar2);
      local_1c8 = 0x3f689374bc6a7efa;
      local_1bc = fVar6;
      testing::internal::CmpHelperLT<float,double>
                (expr1,(char *)CONCAT44(uVar8,uVar7),
                 (float *)CONCAT44(in_stack_fffffffffffffd8c,FVar3),(double *)CONCAT44(FVar4,FVar5))
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd68.memoryResource =
             (memory_resource *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [15])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffd60 =
             (function<float_(float)> *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd58 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [13])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffd50 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd48 =
             (AssertionResult *)
             testing::AssertionResult::failure_message((AssertionResult *)0x641a93);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd00,(Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                   (char *)in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
        testing::Message::~Message((Message *)0x641af6);
      }
      iVar2 = (int)&local_1b8;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x641b4e);
      fVar6 = local_19c - local_1a0;
      std::abs(iVar2);
      testing::internal::CmpHelperLT<float,double>
                (expr1,(char *)CONCAT44(uVar8,uVar7),
                 (float *)CONCAT44(in_stack_fffffffffffffd8c,FVar3),(double *)CONCAT44(FVar4,FVar5))
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
      in_stack_fffffffffffffd40 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd40);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd38 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [19])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffd30 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffcd0,
                   (char (*) [17])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd20 =
             (PiecewiseConstant1D *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd18 =
             testing::AssertionResult::failure_message((AssertionResult *)0x641c8d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd00,(Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                   (char *)in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
        testing::Message::~Message((Message *)0x641ce7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x641d3f);
      in_stack_fffffffffffffd10 = local_194;
      in_stack_fffffffffffffd14 =
           pbrt::InvertTrimmedLogisticSample
                     ((Float)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                      SUB84(in_stack_fffffffffffffce0,0),in_stack_fffffffffffffcdc,
                      in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd0f =
           TestBody::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc
                      ,in_stack_fffffffffffffcd8);
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_fffffffffffffcd0,
                 SUB41((uint)in_stack_fffffffffffffccc >> 0x18,0));
      in_stack_fffffffffffffd0e =
           testing::AssertionResult::operator_cast_to_bool
                     ((AssertionResult *)&stack0xfffffffffffffde0);
      if (!(bool)in_stack_fffffffffffffd0e) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd00 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [5])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
        ;
        in_stack_fffffffffffffcf8 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffcf0 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [9])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
        ;
        in_stack_fffffffffffffce8 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffce0 =
             (function<float_(float)> *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [9])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
        ;
        in_stack_fffffffffffffcdc =
             pbrt::InvertTrimmedLogisticSample
                       ((Float)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                        SUB84(in_stack_fffffffffffffce0,0),in_stack_fffffffffffffcdc,
                        in_stack_fffffffffffffcd8);
        local_22c = in_stack_fffffffffffffcdc;
        in_stack_fffffffffffffcd0 =
             (PiecewiseConstant1D *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffd48,(char *)CONCAT44(fVar6,in_stack_fffffffffffffd40),
                   (char *)in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd00,(Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                   (char *)in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
        std::__cxx11::string::~string(local_258);
        testing::Message::~Message((Message *)0x641f82);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x641ffa);
      pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(local_178);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffcd0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              (&in_stack_fffffffffffffcd0->func);
  }
  return;
}

Assistant:

TEST(Sampling, Logistic) {
    Float params[][3] = {{1., -Pi, Pi}, {5, 0, 3}, {.25, -5, -3}};
    for (const auto p : params) {
        Float s = p[0], a = p[1], b = p[2];
        auto logistic = [&](Float v) { return TrimmedLogistic(v, s, a, b); };

        auto values = Sample1DFunction(logistic, 8192, 16, a, b);
        PiecewiseConstant1D distrib(values, a, b);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedLogistic(u, s, a, b);
            Float cp = TrimmedLogisticPDF(cx, s, a, b);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 3e-3)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedLogisticSample(cx, s, a, b);
        }
    }
}